

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O1

void __thiscall
cmExportInstallFileGenerator::GenerateCxxModuleConfigInformation
          (cmExportInstallFileGenerator *this,ostream *os)

{
  std::__ostream_insert<char,std::char_traits<char>>
            (os,
             "# Load information for each installed configuration.\nfile(GLOB _cmake_cxx_module_includes \"${CMAKE_CURRENT_LIST_DIR}/cxx-modules-*.cmake\")\nforeach(_cmake_cxx_module_include IN LISTS _cmake_cxx_module_includes)\n  include(\"${_cmake_cxx_module_include}\")\nendforeach()\nunset(_cmake_cxx_module_include)\nunset(_cmake_cxx_module_includes)\n"
             ,0x14c);
  return;
}

Assistant:

void cmExportInstallFileGenerator::GenerateCxxModuleConfigInformation(
  std::ostream& os) const
{
  // Now load per-configuration properties for them.
  /* clang-format off */
  os << "# Load information for each installed configuration.\n"
        "file(GLOB _cmake_cxx_module_includes \"${CMAKE_CURRENT_LIST_DIR}/cxx-modules-*.cmake\")\n"
        "foreach(_cmake_cxx_module_include IN LISTS _cmake_cxx_module_includes)\n"
        "  include(\"${_cmake_cxx_module_include}\")\n"
        "endforeach()\n"
        "unset(_cmake_cxx_module_include)\n"
        "unset(_cmake_cxx_module_includes)\n";
  /* clang-format on */
}